

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::traverse_all_reachable_opcodes
          (Compiler *this,SPIRFunction *func,OpcodeHandler *handler)

{
  bool bVar1;
  uint32_t id;
  SPIRBlock *block_00;
  uint32_t local_44;
  TypedID<(spirv_cross::Types)6> *pTStack_40;
  TypedID<(spirv_cross::Types)6> block;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  OpcodeHandler *handler_local;
  SPIRFunction *func_local;
  Compiler *this_local;
  
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                     (&(func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>
                     );
  pTStack_40 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                         (&(func->blocks).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
  while( true ) {
    if (__end1 == pTStack_40) {
      return true;
    }
    local_44 = __end1->id;
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_44);
    block_00 = get<spirv_cross::SPIRBlock>(this,id);
    bVar1 = traverse_all_reachable_opcodes(this,block_00,handler);
    if (!bVar1) break;
    __end1 = __end1 + 1;
  }
  return false;
}

Assistant:

bool Compiler::traverse_all_reachable_opcodes(const SPIRFunction &func, OpcodeHandler &handler) const
{
	for (auto block : func.blocks)
		if (!traverse_all_reachable_opcodes(get<SPIRBlock>(block), handler))
			return false;

	return true;
}